

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture1.c
# Opt level: O3

ktx_error_code_e
ktxTexture1_GetImageOffset
          (ktxTexture1 *This,ktx_uint32_t level,ktx_uint32_t layer,ktx_uint32_t faceSlice,
          ktx_size_t *pOffset)

{
  uint uVar1;
  ktx_size_t kVar2;
  ktx_error_code_e kVar3;
  
  if (This == (ktxTexture1 *)0x0) {
    kVar3 = KTX_INVALID_VALUE;
  }
  else {
    kVar3 = KTX_INVALID_OPERATION;
    if ((level < This->numLevels) && (layer < This->numLayers)) {
      if (This->isCubemap == true) {
        uVar1 = This->numFaces;
      }
      else {
        uVar1 = This->baseDepth >> ((byte)level & 0x1f);
        uVar1 = uVar1 + (uVar1 == 0);
      }
      if (faceSlice < uVar1) {
        kVar2 = (*(This->_protected->_vtbl).calcDataSizeLevels)((ktxTexture *)This,level);
        *pOffset = kVar2;
        if (layer != 0) {
          kVar2 = ktxTexture_layerSize((ktxTexture *)This,level,KTX_FORMAT_VERSION_ONE);
          *pOffset = *pOffset + layer * kVar2;
        }
        kVar3 = KTX_SUCCESS;
        if (faceSlice != 0) {
          kVar2 = (*This->vtbl->GetImageSize)((ktxTexture *)This,level);
          *pOffset = *pOffset + faceSlice * kVar2;
        }
      }
    }
  }
  return kVar3;
}

Assistant:

KTX_error_code
ktxTexture1_GetImageOffset(ktxTexture1* This, ktx_uint32_t level,
                          ktx_uint32_t layer, ktx_uint32_t faceSlice,
                          ktx_size_t* pOffset)
{

    if (This == NULL)
        return KTX_INVALID_VALUE;

    if (level >= This->numLevels || layer >= This->numLayers)
        return KTX_INVALID_OPERATION;

    if (This->isCubemap) {
        if (faceSlice >= This->numFaces)
            return KTX_INVALID_OPERATION;
    } else {
        ktx_uint32_t maxSlice = MAX(1, This->baseDepth >> level);
        if (faceSlice >= maxSlice)
            return KTX_INVALID_OPERATION;
    }

    // Get the size of the data up to the start of the indexed level.
    *pOffset = ktxTexture_calcDataSizeLevels(ktxTexture(This), level);

    // All layers, faces & slices within a level are the same size.
    if (layer != 0) {
        ktx_size_t layerSize;
        layerSize = ktxTexture_layerSize(ktxTexture(This), level,
                                                    KTX_FORMAT_VERSION_ONE);
        *pOffset += layer * layerSize;
    }
    if (faceSlice != 0) {
        ktx_size_t imageSize;
        imageSize = ktxTexture_GetImageSize(ktxTexture(This), level);
#if (KTX_GL_UNPACK_ALIGNMENT != 4)
        if (This->isCubemap)
            _KTX_PAD4(imageSize); // Account for cubePadding.
#endif
        *pOffset += faceSlice * imageSize;
    }

    return KTX_SUCCESS;
}